

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Persistence_landscape_on_grid.h
# Opt level: O2

void __thiscall
Gudhi::Persistence_representations::Persistence_landscape_on_grid::Persistence_landscape_on_grid
          (Persistence_landscape_on_grid *this,char *filename,double grid_min_,double grid_max_,
          size_t number_of_points_,uint number_of_levels_of_landscape,uint16_t dimension)

{
  uint uVar1;
  undefined2 in_register_00000082;
  allocator<char> local_89;
  vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> p;
  string local_58 [32];
  _Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> local_38;
  
  (this->values_of_landscapes).
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->values_of_landscapes).
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->values_of_landscapes).
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  p.super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  p.super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  p.super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (CONCAT22(in_register_00000082,dimension) == 0xffff) {
    uVar1 = number_of_levels_of_landscape;
    std::__cxx11::string::string<std::allocator<char>>(local_58,filename,&local_89);
    read_persistence_intervals_in_one_dimension_from_file
              ((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> *)
               &local_38,(Persistence_representations *)local_58,(string *)0xffffffffffffffff,uVar1,
               -1.0);
  }
  else {
    uVar1 = number_of_levels_of_landscape;
    std::__cxx11::string::string<std::allocator<char>>(local_58,filename,&local_89);
    read_persistence_intervals_in_one_dimension_from_file
              ((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> *)
               &local_38,(Persistence_representations *)local_58,
               (string *)(ulong)CONCAT22(in_register_00000082,dimension),uVar1,-1.0);
  }
  std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
  _M_move_assign(&p,&local_38);
  std::_Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
  ~_Vector_base(&local_38);
  std::__cxx11::string::~string(local_58);
  set_up_values_of_landscapes
            (this,&p,grid_min_,grid_max_,number_of_points_,number_of_levels_of_landscape);
  std::_Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
  ~_Vector_base(&p.
                 super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
               );
  return;
}

Assistant:

Persistence_landscape_on_grid::Persistence_landscape_on_grid(const char* filename, double grid_min_, double grid_max_,
                                                             size_t number_of_points_,
                                                             unsigned number_of_levels_of_landscape,
                                                             uint16_t dimension) {
  std::vector<std::pair<double, double> > p;
  if (dimension == std::numeric_limits<uint16_t>::max()) {
    p = read_persistence_intervals_in_one_dimension_from_file(filename);
  } else {
    p = read_persistence_intervals_in_one_dimension_from_file(filename, dimension);
  }
  this->set_up_values_of_landscapes(p, grid_min_, grid_max_, number_of_points_, number_of_levels_of_landscape);
}